

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O0

Output * __thiscall
ftxui::TerminalInputParser::ParseCursorReporting
          (Output *__return_storage_ptr__,TerminalInputParser *this,
          vector<int,_std::allocator<int>_> *arguments)

{
  size_type sVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *arguments_local;
  TerminalInputParser *this_local;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(arguments);
  if (sVar1 == 2) {
    Output::Output(__return_storage_ptr__,CURSOR_REPORTING);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](arguments,0);
    (__return_storage_ptr__->field_1).cursor.y = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](arguments,1);
    (__return_storage_ptr__->field_1).cursor.x = *pvVar2;
  }
  else {
    Output::Output(__return_storage_ptr__,SPECIAL);
  }
  return __return_storage_ptr__;
}

Assistant:

TerminalInputParser::Output TerminalInputParser::ParseCursorReporting(
    std::vector<int> arguments) {
  if (arguments.size() != 2)
    return SPECIAL;
  Output output(CURSOR_REPORTING);
  output.cursor.y = arguments[0];
  output.cursor.x = arguments[1];
  return output;
}